

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O2

longlong __thiscall
ValueExtractor<long_long>::operator()(ValueExtractor<long_long> *this,int param_1)

{
  runtime_error *this_00;
  undefined4 in_register_00000034;
  char **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,param_1));
  local_40 = (char **)(_compare + (*_compare == '*'));
  fmt::v5::format<char[16],char_const*>
            (&local_38,(v5 *)"invalid type {}",(char (*) [16])&local_40,local_40);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_NORETURN T operator()(U) {
    throw std::runtime_error(fmt::format("invalid type {}", typeid(U).name()));
  }